

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O2

void __thiscall
lunasvg::SVGLinearGradientElement::SVGLinearGradientElement
          (SVGLinearGradientElement *this,Document *document)

{
  SVGGradientElement::SVGGradientElement(&this->super_SVGGradientElement,document,LinearGradient);
  (this->super_SVGGradientElement).super_SVGPaintElement.super_SVGElement.super_SVGNode.
  _vptr_SVGNode = (_func_int **)&PTR__SVGLinearGradientElement_00155158;
  SVGLength::SVGLength(&this->m_x1,X1,Horizontal,Allow,0.0,Percent);
  SVGLength::SVGLength(&this->m_y1,Y1,Vertical,Allow,0.0,Percent);
  SVGLength::SVGLength(&this->m_x2,X2,Horizontal,Allow,100.0,Percent);
  SVGLength::SVGLength(&this->m_y2,Y2,Vertical,Allow,0.0,Percent);
  SVGElement::addProperty((SVGElement *)this,&(this->m_x1).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_y1).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_x2).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_y2).super_SVGProperty);
  return;
}

Assistant:

SVGLinearGradientElement::SVGLinearGradientElement(Document* document)
    : SVGGradientElement(document, ElementID::LinearGradient)
    , m_x1(PropertyID::X1, LengthDirection::Horizontal, LengthNegativeMode::Allow, 0.f, LengthUnits::Percent)
    , m_y1(PropertyID::Y1, LengthDirection::Vertical, LengthNegativeMode::Allow, 0.f, LengthUnits::Percent)
    , m_x2(PropertyID::X2, LengthDirection::Horizontal, LengthNegativeMode::Allow, 100.f, LengthUnits::Percent)
    , m_y2(PropertyID::Y2, LengthDirection::Vertical, LengthNegativeMode::Allow, 0.f, LengthUnits::Percent)
{
    addProperty(m_x1);
    addProperty(m_y1);
    addProperty(m_x2);
    addProperty(m_y2);
}